

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O1

void __thiscall spvtools::opt::InstructionList::~InstructionList(InstructionList *this)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  (this->super_IntrusiveList<spvtools::opt::Instruction>)._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_00948930;
  pIVar2 = (this->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  while ((pIVar2 != (Instruction *)0x0 &&
         ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false))) {
    pIVar1 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar1 == (Instruction *)0x0) {
      __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xcc,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (Instruction *)0x0;
    (*(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
    pIVar2 = (this->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::~IntrusiveList
            (&this->super_IntrusiveList<spvtools::opt::Instruction>);
  operator_delete(this,0x78);
  return;
}

Assistant:

InstructionList::~InstructionList() { clear(); }